

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::enterEvent(QToolButton *this,QEnterEvent *e)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((*(byte *)(lVar1 + 0x2ec) & 8) != 0) {
    QWidget::update((QWidget *)this);
  }
  lVar1 = *(long *)(lVar1 + 0x2f0);
  if (lVar1 != 0) {
    QAction::activate((ActionEvent)lVar1);
  }
  QWidget::enterEvent((QWidget *)this,e);
  return;
}

Assistant:

void QToolButton::enterEvent(QEnterEvent * e)
{
    Q_D(QToolButton);
    if (d->autoRaise)
        update();
    if (d->defaultAction)
        d->defaultAction->hover();
    QAbstractButton::enterEvent(e);
}